

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmocka.c
# Opt level: O2

int integer_in_range_display_error
              (unsigned_long value,unsigned_long range_min,unsigned_long range_max)

{
  if (range_min > value || value > range_max) {
    cm_print_error("%lu is not within the range %lu-%lu\n",value);
  }
  return (uint)(range_min <= value && value <= range_max);
}

Assistant:

static int integer_in_range_display_error(
        const LargestIntegralType value, const LargestIntegralType range_min,
        const LargestIntegralType range_max) {
    if (value >= range_min && value <= range_max) {
        return 1;
    }
    cm_print_error(LargestIntegralTypePrintfFormatDecimal
                   " is not within the range "
                   LargestIntegralTypePrintfFormatDecimal "-"
                   LargestIntegralTypePrintfFormatDecimal "\n",
                   value, range_min, range_max);
    return 0;
}